

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

char * __thiscall
CVmObjByteArray::cast_to_string(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *new_str)

{
  vm_obj_id_t vVar1;
  char *pcVar2;
  CVmByteArraySource src;
  CVmDataSource local_40;
  vm_obj_id_t local_38;
  CVmObjPageEntry *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ulong local_18;
  undefined8 local_10;
  
  local_40._vptr_CVmDataSource = (_func_int **)&PTR__CVmDataSource_003596b8;
  local_10 = 0;
  local_30 = G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff);
  local_28 = 0;
  uStack_20 = 0;
  local_18 = (ulong)**(uint **)((long)&G_obj_table_X.pages_[self >> 0xc][self & 0xfff].ptr_ + 8);
  local_38 = self;
  vVar1 = CVmObjString::create_latin1(0,&local_40);
  new_str->typ = VM_OBJ;
  (new_str->val).obj = vVar1;
  pcVar2 = vm_val_t::get_as_string(new_str);
  return pcVar2;
}

Assistant:

const char *CVmObjByteArray::cast_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *new_str) const
{
    /* set up a source stream to read from the byte array into the string */
    CVmByteArraySource src(vmg_ self);

    /* create the string */
    new_str->set_obj(CVmObjString::create_latin1(vmg_ FALSE, &src));

    /* return the new string's byte buffer */
    return new_str->get_as_string(vmg0_);
}